

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityPrintNumberByStyle(UNITY_INT number,UNITY_DISPLAY_STYLE_T style)

{
  if ((style & 0x10) != 0) {
    UnityPrintNumber(number);
    return;
  }
  if ((style & 0x20) == 0) {
    putchar(0x30);
    putchar(0x78);
    UnityPrintNumberHex(number,(char)style * '\x02' & 0x1e);
    return;
  }
  UnityPrintNumberUnsigned(number);
  return;
}

Assistant:

void UnityPrintNumberByStyle(const UNITY_INT number, const UNITY_DISPLAY_STYLE_T style)
{
    if ((style & UNITY_DISPLAY_RANGE_INT) == UNITY_DISPLAY_RANGE_INT)
    {
        UnityPrintNumber(number);
    }
    else if ((style & UNITY_DISPLAY_RANGE_UINT) == UNITY_DISPLAY_RANGE_UINT)
    {
        UnityPrintNumberUnsigned((UNITY_UINT)number);
    }
    else
    {
        UNITY_OUTPUT_CHAR('0');
        UNITY_OUTPUT_CHAR('x');
        UnityPrintNumberHex((UNITY_UINT)number, (char)((style & 0xF) * 2));
    }
}